

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.h
# Opt level: O2

bool __thiscall
google::protobuf::compiler::objectivec::FieldGenerator::needs_textformat_name_support
          (FieldGenerator *this)

{
  long lVar1;
  string local_30;
  
  variable_abi_cxx11_(&local_30,this,"fieldflags");
  lVar1 = std::__cxx11::string::find((char *)&local_30,0x369b87);
  std::__cxx11::string::~string((string *)&local_30);
  return lVar1 != -1;
}

Assistant:

bool needs_textformat_name_support() const {
    const string& field_flags = variable("fieldflags");
    return field_flags.find("GPBFieldTextFormatNameCustom") != string::npos;
  }